

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

int buffer_open(buffer_t *buffer,char *path)

{
  int iVar1;
  uint8_t *puVar2;
  char *pcVar3;
  GHashTable *pGVar4;
  uint8_t *data;
  stat status;
  int f;
  char *path_local;
  buffer_t *buffer_local;
  
  status.__glibc_reserved[2]._4_4_ = 0;
  memset(&data,0,0x90);
  status.__glibc_reserved[2]._4_4_ = open(path,0);
  if (status.__glibc_reserved[2]._4_4_ < 0) {
    perror("open");
  }
  else {
    buffer->f = status.__glibc_reserved[2]._4_4_;
    iVar1 = fstat(status.__glibc_reserved[2]._4_4_,(stat *)&data);
    if (iVar1 < 0) {
      perror("fstat");
    }
    else {
      buffer->size = status.st_rdev;
      puVar2 = (uint8_t *)mmap((void *)0x0,status.st_rdev,1,2,status.__glibc_reserved[2]._4_4_,0);
      if (puVar2 != (uint8_t *)0xffffffffffffffff) {
        buffer->data = puVar2;
        pcVar3 = strdup(path);
        buffer->path = pcVar3;
        buffer->start_mark = 0xffffffffffffffff;
        buffer->end_mark = 0xffffffffffffffff;
        buffer->cursor = 0;
        pGVar4 = (GHashTable *)g_hash_table_new_full(0,0,0,g_free);
        buffer->comments = pGVar4;
        buffer->highlights = (GSList *)0x0;
        buffer->bookmarks_head = -1;
        buffer->editable = 0;
        return 0;
      }
      perror("mmap");
    }
  }
  if (0 < status.__glibc_reserved[2]._4_4_) {
    close(status.__glibc_reserved[2]._4_4_);
  }
  return 1;
}

Assistant:

int
buffer_open(buffer_t *buffer, const char *path)
{
    int f = 0;
    struct stat status = {};
    uint8_t *data = NULL;

    f = open(path, O_RDONLY);
    if (f < 0) {
        perror("open");
        goto error;
    }

    buffer->f = f;

    if (fstat(f, &status) < 0) {
        perror("fstat");
        goto error;
    }

    buffer->size = status.st_size;

    data = mmap(NULL, status.st_size, PROT_READ, MAP_PRIVATE, f, 0);
    if (data == MAP_FAILED) {
        perror("mmap");
        goto error;
    }

    buffer->data = data;
    buffer->path = strdup(path);
    buffer->start_mark = -1;
    buffer->end_mark = -1;
    buffer->cursor = 0;
    buffer->comments = g_hash_table_new_full(NULL, NULL, NULL, g_free);
    buffer->highlights = NULL;
    buffer->bookmarks_head = -1;
    buffer->editable = 0;
    return 0;
error:
    if (f > 0) {
        close(f);
    }

    return 1;
}